

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O3

IVal * deqp::gls::BuiltinPrecisionTests::
       ContainerTraits<tcu::Matrix<float,_2,_2>,_tcu::Matrix<tcu::Interval,_2,_2>_>::doRound
                 (IVal *__return_storage_ptr__,FloatFormat *fmt,Matrix<float,_2,_2> *value)

{
  Vector<tcu::Interval,_2> *pVVar1;
  Vector<float,_2> local_60;
  IVal local_58;
  
  tcu::Matrix<tcu::Interval,_2,_2>::Matrix(__return_storage_ptr__);
  local_60.m_data = *&(value->m_data).m_data[0].m_data;
  ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doRound
            (&local_58,fmt,&local_60);
  (__return_storage_ptr__->m_data).m_data[0].m_data[1].m_lo = local_58.m_data[1].m_lo;
  (__return_storage_ptr__->m_data).m_data[0].m_data[1].m_hi = local_58.m_data[1].m_hi;
  (__return_storage_ptr__->m_data).m_data[0].m_data[0].m_hi = local_58.m_data[0].m_hi;
  (__return_storage_ptr__->m_data).m_data[0].m_data[1].m_hasNaN = local_58.m_data[1].m_hasNaN;
  *(undefined7 *)&(__return_storage_ptr__->m_data).m_data[0].m_data[1].field_0x1 =
       local_58.m_data[1]._1_7_;
  (__return_storage_ptr__->m_data).m_data[0].m_data[0].m_hasNaN = local_58.m_data[0].m_hasNaN;
  *(undefined7 *)&(__return_storage_ptr__->m_data).m_data[0].m_data[0].field_0x1 =
       local_58.m_data[0]._1_7_;
  (__return_storage_ptr__->m_data).m_data[0].m_data[0].m_lo = local_58.m_data[0].m_lo;
  local_60.m_data = *&(value->m_data).m_data[1].m_data;
  ContainerTraits<tcu::Vector<float,_2>,_tcu::Vector<tcu::Interval,_2>_>::doRound
            (&local_58,fmt,&local_60);
  (__return_storage_ptr__->m_data).m_data[1].m_data[1].m_lo = local_58.m_data[1].m_lo;
  (__return_storage_ptr__->m_data).m_data[1].m_data[1].m_hi = local_58.m_data[1].m_hi;
  (__return_storage_ptr__->m_data).m_data[1].m_data[0].m_hi = local_58.m_data[0].m_hi;
  pVVar1 = (__return_storage_ptr__->m_data).m_data;
  pVVar1[1].m_data[1].m_hasNaN = local_58.m_data[1].m_hasNaN;
  *(undefined7 *)&pVVar1[1].m_data[1].field_0x1 = local_58.m_data[1]._1_7_;
  (__return_storage_ptr__->m_data).m_data[1].m_data[0].m_hasNaN = local_58.m_data[0].m_hasNaN;
  *(undefined7 *)&(__return_storage_ptr__->m_data).m_data[1].m_data[0].field_0x1 =
       local_58.m_data[0]._1_7_;
  (__return_storage_ptr__->m_data).m_data[1].m_data[0].m_lo = local_58.m_data[0].m_lo;
  return __return_storage_ptr__;
}

Assistant:

static IVal			doRound			(const FloatFormat& fmt, T value)
	{
		IVal ret;

		for (int ndx = 0; ndx < T::SIZE; ++ndx)
			ret[ndx] = round(fmt, value[ndx]);

		return ret;
	}